

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

UBool __thiscall icu_63::RuleBasedCollator::operator==(RuleBasedCollator *this,Collator *other)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UnicodeSet *this_00;
  UnicodeSet *o_00;
  LocalPointerBase<icu_63::UnicodeSet> local_40;
  LocalPointer<icu_63::UnicodeSet> otherTailored;
  LocalPointer<icu_63::UnicodeSet> thisTailored;
  UErrorCode errorCode;
  UBool otherIsRoot;
  UBool thisIsRoot;
  RuleBasedCollator *o;
  Collator *other_local;
  RuleBasedCollator *this_local;
  
  if (this == (RuleBasedCollator *)other) {
    this_local._7_1_ = '\x01';
  }
  else {
    UVar1 = Collator::operator==(&this->super_Collator,other);
    if (UVar1 == '\0') {
      this_local._7_1_ = '\0';
    }
    else {
      UVar1 = CollationSettings::operator!=
                        (this->settings,(CollationSettings *)other[2].super_UObject._vptr_UObject);
      if (UVar1 == '\0') {
        if (this->data == (CollationData *)other[1].super_UObject._vptr_UObject) {
          this_local._7_1_ = '\x01';
        }
        else {
          thisTailored.super_LocalPointerBase<icu_63::UnicodeSet>.ptr._7_1_ =
               this->data->base == (CollationData *)0x0;
          thisTailored.super_LocalPointerBase<icu_63::UnicodeSet>.ptr._6_1_ =
               other[1].super_UObject._vptr_UObject[4] == (_func_int *)0x0;
          if (thisTailored.super_LocalPointerBase<icu_63::UnicodeSet>.ptr._7_1_ ==
              thisTailored.super_LocalPointerBase<icu_63::UnicodeSet>.ptr._6_1_) {
            if (((((bool)thisTailored.super_LocalPointerBase<icu_63::UnicodeSet>.ptr._7_1_) ||
                 (UVar1 = UnicodeString::isEmpty(&this->tailoring->rules), UVar1 == '\0')) &&
                ((thisTailored.super_LocalPointerBase<icu_63::UnicodeSet>.ptr._6_1_ != '\0' ||
                 (UVar1 = UnicodeString::isEmpty
                                    ((UnicodeString *)(other[3].super_UObject._vptr_UObject + 5)),
                 UVar1 == '\0')))) &&
               (UVar1 = UnicodeString::operator==
                                  (&this->tailoring->rules,
                                   (UnicodeString *)(other[3].super_UObject._vptr_UObject + 5)),
               UVar1 != '\0')) {
              this_local._7_1_ = '\x01';
            }
            else {
              thisTailored.super_LocalPointerBase<icu_63::UnicodeSet>.ptr._0_4_ = U_ZERO_ERROR;
              iVar2 = (*(this->super_Collator).super_UObject._vptr_UObject[0x1f])();
              LocalPointer<icu_63::UnicodeSet>::LocalPointer
                        (&otherTailored,(UnicodeSet *)CONCAT44(extraout_var,iVar2));
              iVar2 = (*(other->super_UObject)._vptr_UObject[0x1f])(other,&thisTailored);
              LocalPointer<icu_63::UnicodeSet>::LocalPointer
                        ((LocalPointer<icu_63::UnicodeSet> *)&local_40,
                         (UnicodeSet *)CONCAT44(extraout_var_00,iVar2));
              UVar1 = ::U_FAILURE((UErrorCode)
                                  thisTailored.super_LocalPointerBase<icu_63::UnicodeSet>.ptr);
              if (UVar1 == '\0') {
                this_00 = LocalPointerBase<icu_63::UnicodeSet>::operator*
                                    (&otherTailored.super_LocalPointerBase<icu_63::UnicodeSet>);
                o_00 = LocalPointerBase<icu_63::UnicodeSet>::operator*(&local_40);
                UVar1 = UnicodeSet::operator!=(this_00,o_00);
                if (UVar1 == '\0') {
                  this_local._7_1_ = '\x01';
                }
                else {
                  this_local._7_1_ = '\0';
                }
              }
              else {
                this_local._7_1_ = '\0';
              }
              LocalPointer<icu_63::UnicodeSet>::~LocalPointer
                        ((LocalPointer<icu_63::UnicodeSet> *)&local_40);
              LocalPointer<icu_63::UnicodeSet>::~LocalPointer(&otherTailored);
            }
          }
          else {
            this_local._7_1_ = '\0';
          }
        }
      }
      else {
        this_local._7_1_ = '\0';
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
RuleBasedCollator::operator==(const Collator& other) const {
    if(this == &other) { return TRUE; }
    if(!Collator::operator==(other)) { return FALSE; }
    const RuleBasedCollator &o = static_cast<const RuleBasedCollator &>(other);
    if(*settings != *o.settings) { return FALSE; }
    if(data == o.data) { return TRUE; }
    UBool thisIsRoot = data->base == NULL;
    UBool otherIsRoot = o.data->base == NULL;
    U_ASSERT(!thisIsRoot || !otherIsRoot);  // otherwise their data pointers should be ==
    if(thisIsRoot != otherIsRoot) { return FALSE; }
    if((thisIsRoot || !tailoring->rules.isEmpty()) &&
            (otherIsRoot || !o.tailoring->rules.isEmpty())) {
        // Shortcut: If both collators have valid rule strings, then compare those.
        if(tailoring->rules == o.tailoring->rules) { return TRUE; }
    }
    // Different rule strings can result in the same or equivalent tailoring.
    // The rule strings are optional in ICU resource bundles, although included by default.
    // cloneBinary() drops the rule string.
    UErrorCode errorCode = U_ZERO_ERROR;
    LocalPointer<UnicodeSet> thisTailored(getTailoredSet(errorCode));
    LocalPointer<UnicodeSet> otherTailored(o.getTailoredSet(errorCode));
    if(U_FAILURE(errorCode)) { return FALSE; }
    if(*thisTailored != *otherTailored) { return FALSE; }
    // For completeness, we should compare all of the mappings;
    // or we should create a list of strings, sort it with one collator,
    // and check if both collators compare adjacent strings the same
    // (order & strength, down to quaternary); or similar.
    // Testing equality of collators seems unusual.
    return TRUE;
}